

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_lexical_analysis.hpp
# Opt level: O0

void __thiscall LexicalAnalysis::LexicalAnalysis(LexicalAnalysis *this,char *filename)

{
  FILE *pFVar1;
  char *filename_local;
  LexicalAnalysis *this_local;
  
  pFVar1 = fopen(filename,"r");
  this->fp_in = (FILE *)pFVar1;
  memset(this->buffer,0,0x400);
  this->buffer_index = 0;
  this->enable_number = true;
  this->m_line_number = 1;
  this->m_character_number = 0;
  return;
}

Assistant:

explicit LexicalAnalysis(const char* filename) {
        fp_in = fopen(filename, "r");
        memset(buffer, 0, sizeof(char)*MAX_LINE_LENGTH);
        buffer_index = 0;
        enable_number = true;
        m_line_number = 1;
        m_character_number = 0;
    }